

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O2

int mbedtls_pk_setup(mbedtls_pk_context *ctx,mbedtls_pk_info_t *info)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = -16000;
  if ((info != (mbedtls_pk_info_t *)0x0 && ctx != (mbedtls_pk_context *)0x0) &&
     (iVar1 = -16000, ctx->pk_info == (mbedtls_pk_info_t *)0x0)) {
    pvVar2 = (*info->ctx_alloc_func)();
    ctx->pk_ctx = pvVar2;
    if (pvVar2 == (void *)0x0) {
      iVar1 = -0x3f80;
    }
    else {
      ctx->pk_info = info;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_setup( mbedtls_pk_context *ctx, const mbedtls_pk_info_t *info )
{
    if( ctx == NULL || info == NULL || ctx->pk_info != NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ( ctx->pk_ctx = info->ctx_alloc_func() ) == NULL )
        return( MBEDTLS_ERR_PK_ALLOC_FAILED );

    ctx->pk_info = info;

    return( 0 );
}